

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O3

string * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::description_abi_cxx11_
          (string *__return_storage_ptr__,SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,
          bool fullMatrix)

{
  char cVar1;
  ostream *poVar2;
  undefined7 in_register_00000011;
  size_t row;
  size_t col;
  double dVar3;
  const_iterator it;
  const_iterator it_1;
  ostringstream stream;
  ConstIterator local_208;
  ConstIterator local_1d8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if ((int)CONCAT71(in_register_00000011,fullMatrix) == 0) {
    ConstIterator::ConstIterator(&local_208,this,true);
    while ((ConstIterator::ConstIterator(&local_1d8,this,false),
           local_208.m_matrix != local_1d8.m_matrix || (local_208.m_index != -1))) {
      poVar2 = std::ostream::_M_insert<double>(local_208.m_currentTriplet.value);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,") ",2);
      ConstIterator::operator++(&local_208);
    }
  }
  else if (this->m_rows != 0) {
    row = 0;
    do {
      if (this->m_columns != 0) {
        col = 0;
        do {
          dVar3 = operator()(this,row,col);
          poVar2 = std::ostream::_M_insert<double>(dVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          col = col + 1;
        } while (col < this->m_columns);
      }
      cVar1 = (char)(ostringstream *)local_1a8;
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      row = row + 1;
    } while (row < this->m_rows);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string SparseMatrix<ordering>::description(bool fullMatrix) const
    {
        std::ostringstream stream;
        if (!fullMatrix) {
            for (const_iterator it = begin(); it != end(); ++it) {
                stream << it->value << "(" << it->row << ", " << it->column << ") ";
            }
        } else {
            for (std::size_t row = 0; row < rows(); ++row) {
                for (std::size_t col = 0; col < columns(); ++col) {
                    stream << this->operator()(row, col) << " ";
                }
                stream << std::endl;
            }

        }
        return stream.str();
    }